

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

int png_colorspace_set_endpoints
              (png_const_structrp png_ptr,png_colorspacerp colorspace,png_XYZ *XYZ_in,int preferred)

{
  byte *pbVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  png_XYZ XYZ;
  png_xy xy;
  png_XYZ local_a8;
  int local_7c;
  png_xy local_78;
  png_XYZ local_58;
  
  iVar10 = XYZ_in->blue_Z;
  lVar4._0_4_ = XYZ_in->red_X;
  lVar4._4_4_ = XYZ_in->red_Y;
  lVar5._0_4_ = XYZ_in->red_Z;
  lVar5._4_4_ = XYZ_in->green_X;
  lVar6._0_4_ = XYZ_in->green_Y;
  lVar6._4_4_ = XYZ_in->green_Z;
  lVar7._0_4_ = XYZ_in->blue_X;
  lVar7._4_4_ = XYZ_in->blue_Y;
  iVar9 = 1;
  local_a8._0_8_ = lVar4;
  local_a8._8_8_ = lVar5;
  local_a8._16_8_ = lVar6;
  local_a8._24_8_ = lVar7;
  local_a8.blue_Z = iVar10;
  if ((((((-1 < lVar4) && (-1 < (int)(undefined4)lVar6)) && (-1 < lVar7)) &&
       ((-1 < (int)(undefined4)lVar4 && (-1 < lVar5)))) &&
      ((-1 < (int)(undefined4)lVar7 && ((-1 < (int)(undefined4)lVar5 && (-1 < lVar6)))))) &&
     ((int)lVar5._4_4_ <= (int)(lVar4._4_4_ ^ 0x7fffffff) && -1 < iVar10)) {
    local_7c = (undefined4)lVar5;
    bVar8 = false;
    if ((int)((undefined4)lVar6 + lVar4._4_4_ ^ 0x7fffffff) < (int)(undefined4)lVar7)
    goto LAB_002c0ec4;
    iVar11 = (undefined4)lVar6 + lVar4._4_4_ + lVar7._4_4_;
    if (iVar11 != 0) {
      bVar8 = true;
      if (iVar11 == 100000) {
        iVar9 = 0;
      }
      else {
        dVar3 = (double)iVar11;
        iVar11 = 0;
        if ((undefined4)lVar4 != 0) {
          dVar2 = floor(((double)(int)(undefined4)lVar4 * 100000.0) / dVar3 + 0.5);
          bVar8 = false;
          if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002c0ec4;
          iVar11 = (int)dVar2;
        }
        iVar12 = 0;
        local_a8.red_X = iVar11;
        if (lVar4._4_4_ != 0) {
          dVar2 = floor(((double)(int)lVar4._4_4_ * 100000.0) / dVar3 + 0.5);
          bVar8 = false;
          if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002c0ec4;
          iVar12 = (int)dVar2;
        }
        local_a8.red_Y = iVar12;
        iVar12 = 0;
        iVar11 = 0;
        if (local_7c != 0) {
          dVar2 = floor(((double)local_7c * 100000.0) / dVar3 + 0.5);
          bVar8 = false;
          if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002c0ec4;
          iVar11 = (int)dVar2;
        }
        local_a8.red_Z = iVar11;
        if (lVar5._4_4_ != 0) {
          dVar2 = floor(((double)(int)lVar5._4_4_ * 100000.0) / dVar3 + 0.5);
          bVar8 = false;
          if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002c0ec4;
          iVar12 = (int)dVar2;
        }
        local_a8.green_X = iVar12;
        iVar12 = 0;
        iVar11 = 0;
        if ((undefined4)lVar6 != 0) {
          dVar2 = floor(((double)(int)(undefined4)lVar6 * 100000.0) / dVar3 + 0.5);
          bVar8 = false;
          if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002c0ec4;
          iVar11 = (int)dVar2;
        }
        local_a8.green_Y = iVar11;
        if (lVar6._4_4_ != 0) {
          dVar2 = floor(((double)(int)lVar6._4_4_ * 100000.0) / dVar3 + 0.5);
          bVar8 = false;
          if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002c0ec4;
          iVar12 = (int)dVar2;
        }
        local_a8.green_Z = iVar12;
        iVar12 = 0;
        iVar11 = 0;
        if ((undefined4)lVar7 != 0) {
          dVar2 = floor(((double)(int)(undefined4)lVar7 * 100000.0) / dVar3 + 0.5);
          bVar8 = false;
          if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002c0ec4;
          iVar11 = (int)dVar2;
        }
        local_a8.blue_X = iVar11;
        if (lVar7._4_4_ != 0) {
          dVar2 = floor(((double)(int)lVar7._4_4_ * 100000.0) / dVar3 + 0.5);
          bVar8 = false;
          if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002c0ec4;
          iVar12 = (int)dVar2;
        }
        local_a8.blue_Y = iVar12;
        if (iVar10 == 0) {
          local_a8.blue_Z = 0;
        }
        else {
          dVar3 = floor(((double)iVar10 * 100000.0) / dVar3 + 0.5);
          bVar8 = false;
          if ((2147483647.0 < dVar3) || (dVar3 < -2147483648.0)) goto LAB_002c0ec4;
          local_a8.blue_Z = (png_fixed_point)dVar3;
        }
        iVar9 = 0;
        bVar8 = true;
      }
      goto LAB_002c0ec4;
    }
  }
  bVar8 = false;
LAB_002c0ec4:
  if (bVar8) {
    iVar9 = png_xy_from_XYZ(&local_78,&local_a8);
    if (iVar9 == 0) {
      local_58.blue_Z = local_a8.blue_Z;
      local_58.green_Y = local_a8.green_Y;
      local_58.green_Z = local_a8.green_Z;
      local_58.blue_X = local_a8.blue_X;
      local_58.blue_Y = local_a8.blue_Y;
      local_58.red_X = local_a8.red_X;
      local_58.red_Y = local_a8.red_Y;
      local_58.red_Z = local_a8.red_Z;
      local_58.green_X = local_a8.green_X;
      iVar9 = png_colorspace_check_xy(&local_58,&local_78);
    }
  }
  if (iVar9 == 1) {
    pbVar1 = (byte *)((long)&colorspace->flags + 1);
    *pbVar1 = *pbVar1 | 0x80;
    png_benign_error(png_ptr,"invalid end points");
    iVar10 = 0;
  }
  else {
    if (iVar9 != 0) {
      pbVar1 = (byte *)((long)&colorspace->flags + 1);
      *pbVar1 = *pbVar1 | 0x80;
      png_error(png_ptr,"internal error checking chromaticities");
    }
    iVar10 = png_colorspace_set_xy_and_XYZ(png_ptr,colorspace,&local_78,&local_a8,preferred);
  }
  return iVar10;
}

Assistant:

int /* PRIVATE */
png_colorspace_set_endpoints(png_const_structrp png_ptr,
    png_colorspacerp colorspace, const png_XYZ *XYZ_in, int preferred)
{
   png_XYZ XYZ = *XYZ_in;
   png_xy xy;

   switch (png_colorspace_check_XYZ(&xy, &XYZ))
   {
      case 0:
         return png_colorspace_set_xy_and_XYZ(png_ptr, colorspace, &xy, &XYZ,
             preferred);

      case 1:
         /* End points are invalid. */
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_benign_error(png_ptr, "invalid end points");
         break;

      default:
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_error(png_ptr, "internal error checking chromaticities");
   }

   return 0; /* failed */
}